

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::clear_snapshot_sync_ctx(raft_server *this,peer *pp)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<nuraft::snapshot> *in_RSI;
  long in_RDI;
  ptr<snapshot_sync_ctx> snp_ctx;
  shared_ptr<nuraft::snapshot_sync_ctx> *in_stack_ffffffffffffff58;
  shared_ptr<nuraft::snapshot_sync_ctx> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ulong in_stack_ffffffffffffffa0;
  ptr<snapshot> *in_stack_ffffffffffffffa8;
  peer *in_stack_ffffffffffffffb0;
  ptr<snapshot_sync_ctx> *in_stack_ffffffffffffffb8;
  raft_server *in_stack_ffffffffffffffc0;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_20;
  shared_ptr<nuraft::snapshot> *local_10;
  
  local_10 = in_RSI;
  peer::get_snapshot_sync_ctx((peer *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_20);
  if (bVar1) {
    std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    destroy_user_snp_ctx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x280d51);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x280d7c);
      iVar2 = (*peVar3->_vptr_logger[7])();
      if (5 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x280dac);
        peVar4 = std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::get
                           (&local_20);
        msg_if_given_abi_cxx11_(&stack0xffffffffffffffa0,"destroy snapshot sync ctx %p",peVar4);
        (*peVar3->_vptr_logger[8])
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"clear_snapshot_sync_ctx",0x44,&stack0xffffffffffffffa0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      }
    }
  }
  std::shared_ptr<nuraft::snapshot>::shared_ptr(local_10,in_stack_ffffffffffffff58);
  peer::set_snapshot_in_sync
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x280e9c);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x280ea9);
  return;
}

Assistant:

void raft_server::clear_snapshot_sync_ctx(peer& pp) {
    ptr<snapshot_sync_ctx> snp_ctx = pp.get_snapshot_sync_ctx();
    if (snp_ctx) {
        destroy_user_snp_ctx(snp_ctx);
        p_tr("destroy snapshot sync ctx %p", snp_ctx.get());
    }
    pp.set_snapshot_in_sync(nullptr);
}